

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldump.c
# Opt level: O3

int luaU_dump(lua_State *L,Proto *f,lua_Writer w,void *data,int strip)

{
  StkId pSVar1;
  Table *x_;
  lu_byte x_1;
  lu_byte x;
  undefined1 local_71;
  ulong local_70;
  DumpState local_68;
  
  local_68.h = luaH_new(L);
  pSVar1 = (L->top).p;
  (pSVar1->val).value_.gc = (GCObject *)local_68.h;
  (pSVar1->val).tt_ = 'E';
  (L->top).p = (StkId)((L->top).offset + 0x10);
  local_68.nstr = 0;
  local_68.L = L;
  local_68.writer = w;
  local_68.data = data;
  local_68.strip = strip;
  local_68.status = (*w)(L,"\x1bLua",4,data);
  local_68.offset = 4;
  local_70 = CONCAT71(local_70._1_7_,0x55);
  if (local_68.status == 0) {
    local_68.status = (*w)(L,&local_70,1,data);
    local_68.offset = 5;
    local_70 = local_70 & 0xffffffffffffff00;
    if (local_68.status == 0) {
      local_68.status = (*w)(L,&local_70,1,data);
      local_68.offset = 6;
      if (local_68.status == 0) {
        local_68.status = (*w)(L,anon_var_dwarf_eb9b,6,data);
        local_68.offset = 0xc;
        local_70 = CONCAT44(local_70._4_4_,0xffffa988);
        local_71 = 4;
        if (local_68.status == 0) {
          local_68.status = (*w)(L,&local_71,1,data);
          local_68.offset = 0xd;
          if (local_68.status == 0) {
            local_68.status = (*w)(L,&local_70,4,data);
            local_68.offset = 0x11;
            local_70 = CONCAT44(local_70._4_4_,0x12345678);
            local_71 = 4;
            if (local_68.status == 0) {
              local_68.status = (*w)(L,&local_71,1,data);
              local_68.offset = 0x12;
              if (local_68.status == 0) {
                local_68.status = (*w)(L,&local_70,4,data);
                local_68.offset = 0x16;
                local_70 = 0xffffffffffffa988;
                local_71 = 8;
                if (local_68.status == 0) {
                  local_68.status = (*w)(L,&local_71,1,data);
                  local_68.offset = 0x17;
                  if (local_68.status == 0) {
                    local_68.status = (*w)(L,&local_70,8,data);
                    local_68.offset = 0x1f;
                    local_70 = 0xc077280000000000;
                    local_71 = 8;
                    if (local_68.status == 0) {
                      local_68.status = (*w)(L,&local_71,1,data);
                      local_68.offset = 0x20;
                      if (local_68.status == 0) {
                        local_68.status = (*w)(L,&local_70,8,data);
                        local_68.offset = 0x28;
                        local_70 = CONCAT71(local_70._1_7_,(char)f->sizeupvalues);
                        if (local_68.status == 0) {
                          local_68.status = (*w)(L,&local_70,1,data);
                          local_68.offset = 0x29;
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  dumpFunction(&local_68,f);
  if (local_68.status == 0) {
    local_68.status = (*local_68.writer)(local_68.L,(void *)0x0,0,local_68.data);
  }
  return local_68.status;
}

Assistant:

int luaU_dump (lua_State *L, const Proto *f, lua_Writer w, void *data,
               int strip) {
  DumpState D;
  D.h = luaH_new(L);  /* aux. table to keep strings already dumped */
  sethvalue2s(L, L->top.p, D.h);  /* anchor it */
  L->top.p++;
  D.L = L;
  D.writer = w;
  D.offset = 0;
  D.data = data;
  D.strip = strip;
  D.status = 0;
  D.nstr = 0;
  dumpHeader(&D);
  dumpByte(&D, f->sizeupvalues);
  dumpFunction(&D, f);
  dumpBlock(&D, NULL, 0);  /* signal end of dump */
  return D.status;
}